

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall
Psbt_GetUtxoDataList_Test::~Psbt_GetUtxoDataList_Test(Psbt_GetUtxoDataList_Test *this)

{
  void *in_RDI;
  
  ~Psbt_GetUtxoDataList_Test((Psbt_GetUtxoDataList_Test *)0x2b2158);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(Psbt, GetUtxoDataList) {
  Psbt psbt("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCICmYYqZ6m0VNbNpf7jSlLZCJv6AkRE2IAxw0qY4pi9vKAiBLR/z1B7gJVBCOA3VnP9vdCExfu5lPbJUXIPLrL2u4ZgEBAwQBAAAAAQQWABSWLE4I8zbTr7w0FcnTWa4QQEcFICIGAlZSSEYLPBht7PE9sG8HJP1QtHzD5InDAHbINj1QOM7+GCpwR2AsAACAAAAAgAAAAIABAAAAAQAAAAABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAACICAtn2iI8oWhWmoYgKIgLCsjCkLXfPYtpqSKykGYJizaPHRzBEAiBm7JVulng81hIsnAdzKjrpkxtpq9r/HzYsKO1fqWco0wIgahbUrkb+1I09BJJzdhO9m1H+PiRTtERuRHxlvyyWfhABIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAA");
  auto utxos = psbt.GetUtxoDataAll(NetType::kTestnet);
  EXPECT_EQ(2, utxos.size());
  if (utxos.size() == 2) {
    EXPECT_EQ("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26", utxos[0].txid.GetHex());
    EXPECT_EQ(1, utxos[0].vout);
    EXPECT_EQ("2MzbWwSa1GsmzGLhYbsYRACNhgx4RjqGtTi", utxos[0].address.GetAddress());
    EXPECT_EQ(AddressType::kP2shP2wpkhAddress, utxos[0].address_type);
    EXPECT_EQ(100000000, utxos[0].amount.GetSatoshiValue());
    EXPECT_EQ("sh(wpkh([2a704760/44'/0'/0'/1/1]02565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe))", utxos[0].descriptor);

    EXPECT_EQ("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d", utxos[1].txid.GetHex());
    EXPECT_EQ(0, utxos[1].vout);
    EXPECT_EQ("mtPAE24cZ3k6NMCcxQJUbSpZnSVaCu96Wj", utxos[1].address.GetAddress());
    EXPECT_EQ(AddressType::kP2pkhAddress, utxos[1].address_type);
    EXPECT_EQ(499995000, utxos[1].amount.GetSatoshiValue());
    EXPECT_EQ("pkh([9d6b6d86/44'/0'/0'/0/1]02d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7)", utxos[1].descriptor);
  }
}